

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

int __thiscall
common::Config::GetHosts
          (Config *this,string *group,string *tag,
          vector<common::Host,_std::allocator<common::Host>_> *hosts)

{
  pointer psVar1;
  long lVar2;
  __type _Var3;
  difference_type dVar4;
  size_t i;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = 0;
  uVar5 = 0;
  iVar6 = 0;
  do {
    psVar1 = (this->m_hosts).
             super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_hosts).
                      super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5) {
      return iVar6;
    }
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)((long)&(psVar1->
                                              super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar7) + 0xa0),group);
    if (_Var3) {
      if (tag->_M_string_length != 0) {
        lVar2 = *(long *)((long)&(((this->m_hosts).
                                   super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar7);
        dVar4 = std::
                __count_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (lVar2 + 0x88),
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (lVar2 + 0x90),
                           (_Iter_equals_val<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )tag);
        if (dVar4 < 1) goto LAB_0010db2d;
      }
      std::vector<common::Host,_std::allocator<common::Host>_>::push_back
                (hosts,*(value_type **)
                        ((long)&(((this->m_hosts).
                                  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        + lVar7));
      iVar6 = iVar6 + 1;
    }
LAB_0010db2d:
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

int Config::GetHosts(const std::string& group, const std::string& tag, std::vector<Host>* hosts) {
    int num = 0;
    for (size_t i = 0; i < m_hosts.size(); i++) {
        if (m_hosts[i]->group == group) {
            std::vector<std::string>& v = m_hosts[i]->tags;
            if (tag.empty() || std::count(v.begin(), v.end(), tag) > 0) {
                hosts->push_back(*m_hosts[i]);
                num++;
            }
        }
    }
    return num;
}